

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_single
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool *positional_only)

{
  Option *pOVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  Classifier current_type;
  Option_p *opt;
  pointer puVar6;
  pointer psVar7;
  HorribleError *this_00;
  App *pAVar8;
  Classifier local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if (*positional_only == false) {
    current_type = _recognize(this,(string *)
                                   ((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + -1),true);
    switch(current_type) {
    case NONE:
      goto switchD_0026209c_caseD_0;
    case POSITIONAL_MARK:
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
      pcVar3 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar2[-1].field_2) {
        operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
      }
      *positional_only = true;
      for (puVar6 = (this->options_).
                    super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar6 != (this->options_).
                    super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
        pOVar1 = (puVar6->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((pOVar1->pname_)._M_string_length != 0) &&
           ((int)((ulong)((long)*(pointer *)
                                 ((long)&(pOVar1->results_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 + 8) -
                         *(long *)&(pOVar1->results_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl) >> 5) < pOVar1->expected_min_ * pOVar1->type_size_min_)
           ) goto LAB_00262171;
      }
      if (this->parent_ == (App *)0x0) {
LAB_00262171:
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"--","");
        local_64 = POSITIONAL_MARK;
        pAVar8 = this;
        if (this->allow_extras_ == false) {
          psVar7 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          while ((pAVar8 = this,
                 psVar7 != (this->subcommands_).
                           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish &&
                 ((pAVar8 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr, (pAVar8->name_)._M_string_length != 0 ||
                  (pAVar8->allow_extras_ == false))))) {
            psVar7 = psVar7 + 1;
          }
        }
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&pAVar8->missing_,&local_64,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      break;
    case SHORT:
    case LONG:
    case WINDOWS_STYLE:
      bVar5 = _parse_arg(this,args,current_type,false);
      return bVar5;
    case SUBCOMMAND:
      bVar5 = _parse_subcommand(this,args);
      return bVar5;
    case SUBCOMMAND_TERMINATOR:
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar2 + -1;
      pcVar3 = pbVar2[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &pbVar2[-1].field_2) {
        operator_delete(pcVar3,pbVar2[-1].field_2._M_allocated_capacity + 1);
      }
      break;
    default:
      this_00 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"unrecognized classifier (you should not see this!)","");
      HorribleError::HorribleError(this_00,&local_40);
      __cxa_throw(this_00,&HorribleError::typeinfo,Error::~Error);
    }
    bVar5 = false;
  }
  else {
switchD_0026209c_caseD_0:
    bVar5 = false;
    bVar4 = _parse_positional(this,args,false);
    if ((bVar4) && (bVar5 = true, this->positionals_at_end_ == true)) {
      *positional_only = true;
    }
  }
  return bVar5;
}

Assistant:

CLI11_INLINE bool App::_parse_single(std::vector<std::string> &args, bool &positional_only) {
    bool retval = true;
    detail::Classifier classifier = positional_only ? detail::Classifier::NONE : _recognize(args.back());
    switch(classifier) {
    case detail::Classifier::POSITIONAL_MARK:
        args.pop_back();
        positional_only = true;
        if((!_has_remaining_positionals()) && (parent_ != nullptr)) {
            retval = false;
        } else {
            _move_to_missing(classifier, "--");
        }
        break;
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
        // treat this like a positional mark if in the parent app
        args.pop_back();
        retval = false;
        break;
    case detail::Classifier::SUBCOMMAND:
        retval = _parse_subcommand(args);
        break;
    case detail::Classifier::LONG:
    case detail::Classifier::SHORT:
    case detail::Classifier::WINDOWS_STYLE:
        // If already parsed a subcommand, don't accept options_
        retval = _parse_arg(args, classifier, false);
        break;
    case detail::Classifier::NONE:
        // Probably a positional or something for a parent (sub)command
        retval = _parse_positional(args, false);
        if(retval && positionals_at_end_) {
            positional_only = true;
        }
        break;
        // LCOV_EXCL_START
    default:
        throw HorribleError("unrecognized classifier (you should not see this!)");
        // LCOV_EXCL_STOP
    }
    return retval;
}